

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O2

void __thiscall MILBlob::Blob::StorageReader::Impl::~Impl(Impl *this)

{
  std::
  unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
  ::~unique_ptr(&this->m_reader);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Impl() = default;